

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

char * readDataOfferAsString(wl_data_offer *offer,char *mimeType)

{
  ulong size;
  PFN_wl_proxy_marshal_flags p_Var1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  char *pcVar5;
  ssize_t sVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  int fds [2];
  int local_38;
  int local_34;
  
  iVar3 = pipe2(&local_38,0x80000);
  iVar2 = local_34;
  p_Var1 = _glfw.wl.client.proxy_marshal_flags;
  if (iVar3 == -1) {
    piVar7 = __errno_location();
    pcVar5 = strerror(*piVar7);
    _glfwInputError(0x10008,"Wayland: Failed to create pipe for data offer: %s",pcVar5);
    return (char *)0x0;
  }
  uVar4 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)offer);
  lVar8 = 0;
  (*p_Var1)((wl_proxy *)offer,1,(wl_interface *)0x0,uVar4,0,mimeType,iVar2);
  flushDisplay();
  close(local_34);
  uVar9 = 0;
  pcVar5 = (char *)0x0;
  do {
    size = lVar8 + 0x1001;
    while( true ) {
      if ((uVar9 < size) &&
         (pcVar5 = (char *)_glfw_realloc(pcVar5,size), uVar9 = size, pcVar5 == (char *)0x0)) {
        _glfwInputError(0x10005,(char *)0x0);
        goto LAB_00127b67;
      }
      sVar6 = read(local_38,pcVar5 + lVar8,0x1000);
      if (sVar6 != -1) break;
      piVar7 = __errno_location();
      if (*piVar7 != 4) {
        pcVar5 = strerror(*piVar7);
        _glfwInputError(0x10008,"Wayland: Failed to read from data offer pipe: %s",pcVar5);
LAB_00127b67:
        close(local_38);
        return (char *)0x0;
      }
    }
    if (sVar6 == 0) {
      close(local_38);
      pcVar5[lVar8] = '\0';
      return pcVar5;
    }
    lVar8 = lVar8 + sVar6;
  } while( true );
}

Assistant:

static char* readDataOfferAsString(struct wl_data_offer* offer, const char* mimeType)
{
    int fds[2];

    if (pipe2(fds, O_CLOEXEC) == -1)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to create pipe for data offer: %s",
                        strerror(errno));
        return NULL;
    }

    wl_data_offer_receive(offer, mimeType, fds[1]);
    flushDisplay();
    close(fds[1]);

    char* string = NULL;
    size_t size = 0;
    size_t length = 0;

    for (;;)
    {
        const size_t readSize = 4096;
        const size_t requiredSize = length + readSize + 1;
        if (requiredSize > size)
        {
            char* longer = _glfw_realloc(string, requiredSize);
            if (!longer)
            {
                _glfwInputError(GLFW_OUT_OF_MEMORY, NULL);
                close(fds[0]);
                return NULL;
            }

            string = longer;
            size = requiredSize;
        }

        const ssize_t result = read(fds[0], string + length, readSize);
        if (result == 0)
            break;
        else if (result == -1)
        {
            if (errno == EINTR)
                continue;

            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Wayland: Failed to read from data offer pipe: %s",
                            strerror(errno));
            close(fds[0]);
            return NULL;
        }

        length += result;
    }

    close(fds[0]);

    string[length] = '\0';
    return string;
}